

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O0

void CMU462::Viewer::resize_callback(GLFWwindow *window,int width,int height)

{
  int local_20;
  int local_1c;
  int h;
  int w;
  int height_local;
  int width_local;
  GLFWwindow *window_local;
  
  h = height;
  w = width;
  _height_local = window;
  glfwGetFramebufferSize(window,&local_1c,&local_20);
  _buffer_w = (size_t)local_1c;
  _buffer_h = (size_t)local_20;
  glViewport(0,0,local_1c,local_20);
  OSDText::resize(osd_text,_buffer_w,_buffer_h);
  if (renderer != (long *)0x0) {
    (**(code **)(*renderer + 0x20))(renderer,_buffer_w,_buffer_h);
  }
  return;
}

Assistant:

void Viewer::resize_callback( GLFWwindow* window, int width, int height ) {

  // get framebuffer size
  int w, h; 
  glfwGetFramebufferSize(window, &w, &h );
    
  // update buffer size
  buffer_w = w; buffer_h = h;
  glViewport( 0, 0, buffer_w, buffer_h );

  // resize on-screen display
  osd_text->resize(buffer_w, buffer_h);

  // resize render if there is a user space renderer
  if (renderer) renderer->resize( buffer_w, buffer_h );  
}